

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O3

void * utf8pbrk(void *str,void *accept)

{
  char *pcVar1;
  void *pvVar2;
  char cVar3;
  char *s;
  long lVar4;
  
  if (*str == '\0') {
    return (void *)0x0;
  }
LAB_00111520:
  if (*accept != '\0') {
    lVar4 = 0;
    pvVar2 = accept;
    cVar3 = *accept;
    do {
      if (cVar3 == *(char *)((long)str + lVar4)) {
        lVar4 = lVar4 + 1;
        cVar3 = *(char *)((long)pvVar2 + 1);
        if (cVar3 == '\0') goto LAB_0011157a;
      }
      else {
        cVar3 = *(char *)((long)pvVar2 + 1);
        if (cVar3 == '\0') break;
        lVar4 = 0;
      }
      pvVar2 = (void *)((long)pvVar2 + 1);
      if (lVar4 != 0) {
        return str;
      }
    } while( true );
  }
  goto LAB_0011157f;
LAB_0011157a:
  if (lVar4 != 0) {
    return str;
  }
LAB_0011157f:
  pcVar1 = (char *)((long)str + 1);
  str = (void *)((long)str + 1);
  if (*pcVar1 == '\0') {
    return (void *)0x0;
  }
  goto LAB_00111520;
}

Assistant:

void *utf8pbrk(const void *str, const void *accept) {
  const char *s = (const char *)str;

  while ('\0' != *s) {
    const char *a = (const char *)accept;
    size_t offset = 0;

    while ('\0' != *a) {
      // checking that if *a is the start of a utf8 codepoint
      // (it is not 0b10xxxxxx) and we have successfully matched
      // a previous character (0 < offset) - we found a match
      if ((0x80 != (0xc0 & *a)) && (0 < offset)) {
        return (void *)s;
      } else {
        if (*a == s[offset]) {
          // part of a utf8 codepoint matched, so move our checking
          // onwards to the next byte
          offset++;
          a++;
        } else {
          // r could be in the middle of an unmatching utf8 code point,
          // so we need to march it on to the next character beginning,

          do {
            a++;
          } while (0x80 == (0xc0 & *a));

          // reset offset too as we found a mismatch
          offset = 0;
        }
      }
    }

    // we found a match on the last utf8 codepoint
    if (0 < offset) {
      return (void *)s;
    }

    // the current utf8 codepoint in src did not match accept, but src
    // could have been partway through a utf8 codepoint, so we need to
    // march it onto the next utf8 codepoint starting byte
    do {
      s++;
    } while ((0x80 == (0xc0 & *s)));
  }

  return 0;
}